

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  char *__nptr;
  cmCTestBuildAndTestHandler *this_00;
  _Rb_tree_node_base *p_Var9;
  cmCTestGenericHandler *pcVar10;
  byte bVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  cmCTest *pcVar13;
  _Alloc_hider this_01;
  string *s;
  undefined1 auVar14 [16];
  ulong local_238;
  bool SRArgumentSpecified;
  uint local_22c;
  uint local_228;
  int local_224;
  cmCTest *local_220;
  string errormsg;
  char *local_1f8 [4];
  string *local_1d8;
  string *local_1d0;
  string arg;
  string targ;
  
  SRArgumentSpecified = false;
  local_1d8 = output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,
             (this->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_1d0 = &this->ScheduleType;
  p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
  local_22c = (uint)CONCAT71((int7)((ulong)local_1d0 >> 8),1);
  local_228 = 0;
  uVar12 = extraout_RDX;
  local_220 = this;
  for (local_238 = 1;
      local_238 <
      (ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5); local_238 = local_238 + 1) {
    errormsg._M_dataplus._M_p = (pointer)&errormsg.field_2;
    errormsg._M_string_length = 0;
    errormsg.field_2._M_local_buf[0] = '\0';
    bVar4 = HandleCommandLineArguments(this,&local_238,args,&errormsg);
    if (bVar4) {
      HandleScriptArguments(this,&local_238,args,&SRArgumentSpecified);
      pcVar13 = (cmCTest *)&arg;
      std::__cxx11::string::string
                ((string *)&arg,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + local_238));
      bVar4 = CheckArgument(pcVar13,&arg,"-D","--dashboard");
      if ((bVar4) &&
         (pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         local_238 <
         ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
        this->ProduceXML = true;
        local_238 = local_238 + 1;
        std::__cxx11::string::string((string *)&targ,(string *)(pbVar2 + local_238));
        bVar4 = AddTestsForDashboardType(this,&targ);
        if ((!bVar4) && (bVar4 = AddVariableDefinition(this,&targ), !bVar4)) {
          ErrorMessageUnknownDashDValue(this,&targ);
          local_22c = 0;
        }
        std::__cxx11::string::~string((string *)&targ);
      }
      this_01._M_p = (pointer)&arg;
      bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &arg,"-D");
      if ((bVar4) &&
         (this_01 = arg._M_dataplus,
         bVar4 = cmsys::SystemTools::StringStartsWith(arg._M_dataplus._M_p,"-D"), bVar4)) {
        this_01._M_p = (pointer)&targ;
        std::__cxx11::string::substr((ulong)this_01._M_p,(ulong)&arg);
        AddVariableDefinition(this,(string *)this_01._M_p);
        std::__cxx11::string::~string((string *)this_01._M_p);
      }
      bVar4 = CheckArgument((cmCTest *)this_01._M_p,&arg,"-T","--test-action");
      if ((bVar4) &&
         (pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         local_238 <
         ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
        this->ProduceXML = true;
        local_238 = local_238 + 1;
        this_01._M_p = (pointer)this;
        bVar4 = SetTest(this,pbVar2[local_238]._M_dataplus._M_p,false);
        if (!bVar4) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
          poVar7 = std::operator<<((ostream *)&targ,"CTest -T called with incorrect option: ");
          poVar7 = std::operator<<(poVar7,(string *)
                                          ((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + local_238));
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
              ,0x990,local_1f8[0],false);
          std::__cxx11::string::~string((string *)local_1f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
          poVar7 = std::operator<<((ostream *)&targ,"Available options are:");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T all");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T start");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T update");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T configure");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T build");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T test");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T coverage");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T memcheck");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T notes");
          poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
          poVar7 = std::operator<<(poVar7,"  ");
          poVar7 = std::operator<<(poVar7,"ctest");
          poVar7 = std::operator<<(poVar7," -T submit");
          std::endl<char,std::char_traits<char>>(poVar7);
          std::__cxx11::stringbuf::str();
          Log(this,6,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
              ,0x99b,local_1f8[0],false);
          std::__cxx11::string::~string((string *)local_1f8);
          this_01._M_p = (pointer)&targ;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01._M_p);
          local_22c = 0;
        }
      }
      bVar4 = CheckArgument((cmCTest *)this_01._M_p,&arg,"-M","--test-model");
      if ((bVar4) &&
         (pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         local_238 <
         ((long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
        local_238 = local_238 + 1;
        s = pbVar2 + local_238;
        cmsys::SystemTools::LowerCase(&targ,s);
        bVar4 = std::operator==(&targ,"nightly");
        std::__cxx11::string::~string((string *)&targ);
        if (bVar4) {
          local_220->InteractiveDebugMode = false;
          local_220->TestModel = 1;
          this = local_220;
        }
        else {
          cmsys::SystemTools::LowerCase(&targ,s);
          bVar4 = std::operator==(&targ,"continuous");
          std::__cxx11::string::~string((string *)&targ);
          if (bVar4) {
            local_220->InteractiveDebugMode = false;
            local_220->TestModel = 2;
            this = local_220;
          }
          else {
            cmsys::SystemTools::LowerCase(&targ,s);
            bVar4 = std::operator==(&targ,"experimental");
            std::__cxx11::string::~string((string *)&targ);
            if (bVar4) {
              local_220->InteractiveDebugMode = false;
              local_220->TestModel = 0;
              this = local_220;
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
              this = local_220;
              poVar7 = std::operator<<((ostream *)&targ,"CTest -M called with incorrect option: ");
              poVar7 = std::operator<<(poVar7,(string *)s);
              std::endl<char,std::char_traits<char>>(poVar7);
              std::__cxx11::stringbuf::str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0x9b6,local_1f8[0],false);
              std::__cxx11::string::~string((string *)local_1f8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
              poVar7 = std::operator<<((ostream *)&targ,"Available options are:");
              poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
              poVar7 = std::operator<<(poVar7,"  ");
              poVar7 = std::operator<<(poVar7,"ctest");
              poVar7 = std::operator<<(poVar7," -M Continuous");
              poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
              poVar7 = std::operator<<(poVar7,"  ");
              poVar7 = std::operator<<(poVar7,"ctest");
              poVar7 = std::operator<<(poVar7," -M Experimental");
              poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
              poVar7 = std::operator<<(poVar7,"  ");
              poVar7 = std::operator<<(poVar7,"ctest");
              poVar7 = std::operator<<(poVar7," -M Nightly");
              std::endl<char,std::char_traits<char>>(poVar7);
              std::__cxx11::stringbuf::str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                  ,0x9ba,local_1f8[0],false);
              std::__cxx11::string::~string((string *)local_1f8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
              local_22c = 0;
            }
          }
        }
      }
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &arg,"--extra-submit");
      if ((bVar4) &&
         (local_238 <
          ((long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
        this->ProduceXML = true;
        SetTest(this,"Submit",true);
        local_238 = local_238 + 1;
        bVar4 = SubmitExtraFiles(this,(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start[local_238].
                                      _M_dataplus._M_p);
        if (bVar4) goto LAB_002ae6ae;
LAB_002ae7a3:
        bVar4 = false;
        local_224 = 0;
      }
      else {
LAB_002ae6ae:
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&arg,"--build-and-test");
        if (bVar4) {
          local_228 = CONCAT31((int3)(local_228 >> 8),
                               (byte)local_228 |
                               local_238 <
                               ((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
        }
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&arg,"--schedule-random");
        if (bVar4) {
          std::__cxx11::string::assign((char *)local_1d0);
        }
        for (p_Var8 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var8 != p_Var1; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)
            ) {
          iVar5 = (**(code **)(**(long **)(p_Var8 + 2) + 0x30))
                            (*(long **)(p_Var8 + 2),(cmCTest *)&arg,&local_238,args);
          if (iVar5 == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
            std::operator<<((ostream *)&targ,
                            "Problem parsing command line arguments within a handler");
            std::__cxx11::stringbuf::str();
            Log(this,6,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
                ,0x9df,local_1f8[0],false);
            std::__cxx11::string::~string((string *)local_1f8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
            goto LAB_002ae7a3;
          }
        }
        bVar4 = true;
      }
      std::__cxx11::string::~string((string *)&arg);
    }
    else {
      bVar4 = false;
      cmSystemTools::Error(errormsg._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      local_224 = 1;
    }
    std::__cxx11::string::~string((string *)&errormsg);
    if (!bVar4) {
      return local_224;
    }
    uVar12 = extraout_RDX_00;
  }
  if ((this->ParallelLevelSetInCli == false) &&
     (__nptr = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL"), uVar12 = extraout_RDX_01,
     __nptr != (char *)0x0)) {
    iVar6 = atoi(__nptr);
    iVar5 = 1;
    if (1 < iVar6) {
      iVar5 = iVar6;
    }
    this->ParallelLevel = iVar5;
    uVar12 = extraout_RDX_02;
  }
  if ((local_228 & 1) == 0) {
    if ((local_22c & 1) == 0) {
      return 1;
    }
    if (this->RunConfigurationScript == true) {
      bVar11 = this->ExtraVerbose;
      if ((bool)bVar11 == true) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
        poVar7 = std::operator<<((ostream *)&targ,"* Extra verbosity turned on");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        Log(this,1,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0xa0a,errormsg._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&errormsg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
        bVar11 = this->ExtraVerbose;
      }
      iVar5 = this->SubmitIndex;
      for (p_Var9 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pcVar13 = local_220, (_Rb_tree_header *)p_Var9 != p_Var1;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        lVar3 = *(long *)(p_Var9 + 2);
        *(uint *)(lVar3 + 0x18) = (uint)bVar11;
        *(int *)(lVar3 + 0x90) = iVar5;
      }
      pcVar10 = GetHandler(local_220,"script");
      pcVar10->HandlerVerbose = (uint)pcVar13->Verbose;
      pcVar10 = GetHandler(pcVar13,"script");
      iVar5 = (*(pcVar10->super_cmObject)._vptr_cmObject[5])(pcVar10);
      if (iVar5 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
        poVar7 = std::operator<<((ostream *)&targ,"running script failing returning: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        Log(pcVar13,0,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0xa19,errormsg._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&errormsg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
LAB_002aeb41:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
        poVar7 = std::operator<<((ostream *)&targ,"Running a test(s) failed returning : ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        Log(pcVar13,0,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0xa3b,errormsg._M_dataplus._M_p,false);
        goto LAB_002aeba3;
      }
    }
    else {
      this->ExtraVerbose = this->Verbose;
      this->Verbose = true;
      auVar14._8_8_ = uVar12;
      auVar14._0_8_ = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar5 = this->SubmitIndex;
      while (p_Var9 = auVar14._0_8_, (_Rb_tree_header *)p_Var9 != p_Var1) {
        lVar3 = *(long *)(p_Var9 + 2);
        *(undefined4 *)(lVar3 + 0x18) = 1;
        *(int *)(lVar3 + 0x90) = iVar5;
        auVar14 = std::_Rb_tree_increment(p_Var9);
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&errormsg,(SystemTools *)0x1,auVar14[8]);
      pcVar13 = local_220;
      iVar5 = Initialize(local_220,errormsg._M_dataplus._M_p,(cmCTestStartCommand *)0x0);
      if (iVar5 == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
        poVar7 = std::operator<<((ostream *)&targ,"Problem initializing the dashboard.");
        std::endl<char,std::char_traits<char>>(poVar7);
        std::__cxx11::stringbuf::str();
        Log(pcVar13,6,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0xa30,arg._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&arg);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
        iVar5 = 0xc;
      }
      else {
        iVar5 = ProcessTests(pcVar13);
      }
      std::__cxx11::string::~string((string *)&errormsg);
      if (iVar5 != 0) goto LAB_002aeb41;
    }
LAB_002aebbc:
    iVar5 = 0;
  }
  else {
    this->Verbose = true;
    this_00 = (cmCTestBuildAndTestHandler *)GetHandler(this,"buildtest");
    iVar5 = (*(this_00->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[5])(this_00);
    cmCTestBuildAndTestHandler::GetOutput(this_00);
    std::__cxx11::string::assign((char *)local_1d8);
    cmDynamicLoader::FlushCache();
    if (iVar5 == 0) goto LAB_002aebbc;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&targ);
    poVar7 = std::operator<<((ostream *)&targ,"build and test failing returning: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    std::endl<char,std::char_traits<char>>(poVar7);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x9fd,errormsg._M_dataplus._M_p,false);
LAB_002aeba3:
    std::__cxx11::string::~string((string *)&errormsg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targ);
  }
  return iVar5;
}

Assistant:

int cmCTest::Run(std::vector<std::string> &args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
      this->InitialCommandLineArguments.end(),
      args.begin(), args.end());

  // process the command line arguments
  for(size_t i=1; i < args.size(); ++i)
    {
    // handle the simple commandline arguments
    std::string errormsg;
    if(!this->HandleCommandLineArguments(i,args, errormsg))
      {
      cmSystemTools::Error(errormsg.c_str());
      return 1;
      }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i,args,SRArgumentSpecified);

    // handle a request for a dashboard
    std::string arg = args[i];
    if(this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1 )
      {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ))
        {
        if (!this->AddVariableDefinition(targ))
          {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
          }
        }
      }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if(arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D"))
      {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
      }

    if(this->CheckArgument(arg, "-T", "--test-action") &&
      (i < args.size() -1) )
      {
      this->ProduceXML = true;
      i++;
      if ( !this->SetTest(args[i].c_str(), false) )
        {
        executeTests = false;
        cmCTestLog(this, ERROR_MESSAGE,
          "CTest -T called with incorrect option: "
          << args[i] << std::endl);
        cmCTestLog(this, ERROR_MESSAGE, "Available options are:" << std::endl
          << "  " << ctestExec << " -T all" << std::endl
          << "  " << ctestExec << " -T start" << std::endl
          << "  " << ctestExec << " -T update" << std::endl
          << "  " << ctestExec << " -T configure" << std::endl
          << "  " << ctestExec << " -T build" << std::endl
          << "  " << ctestExec << " -T test" << std::endl
          << "  " << ctestExec << " -T coverage" << std::endl
          << "  " << ctestExec << " -T memcheck" << std::endl
          << "  " << ctestExec << " -T notes" << std::endl
          << "  " << ctestExec << " -T submit" << std::endl);
        }
      }

    // what type of test model
    if(this->CheckArgument(arg, "-M", "--test-model") &&
      (i < args.size() -1) )
      {
      i++;
      std::string const& str = args[i];
      if ( cmSystemTools::LowerCase(str) == "nightly" )
        {
        this->SetTestModel(cmCTest::NIGHTLY);
        }
      else if ( cmSystemTools::LowerCase(str) == "continuous" )
        {
        this->SetTestModel(cmCTest::CONTINUOUS);
        }
      else if ( cmSystemTools::LowerCase(str) == "experimental" )
        {
        this->SetTestModel(cmCTest::EXPERIMENTAL);
        }
      else
        {
        executeTests = false;
        cmCTestLog(this, ERROR_MESSAGE,
          "CTest -M called with incorrect option: " << str
          << std::endl);
        cmCTestLog(this, ERROR_MESSAGE, "Available options are:" << std::endl
          << "  " << ctestExec << " -M Continuous" << std::endl
          << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
        }
      }

    if(this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1)
      {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if ( !this->SubmitExtraFiles(args[i].c_str()) )
        {
        return 0;
        }
      }

    // --build-and-test options
    if(this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1)
      {
      cmakeAndTest = true;
      }

    if(this->CheckArgument(arg, "--schedule-random"))
      {
      this->ScheduleType = "Random";
      }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    cmCTest::t_TestingHandlers::iterator it;
    for ( it = this->TestingHandlers.begin();
      it != this->TestingHandlers.end();
      ++ it )
      {
      if ( !it->second->ProcessCommandLineArguments(arg, i, args) )
        {
        cmCTestLog(this, ERROR_MESSAGE,
          "Problem parsing command line arguments within a handler");
        return 0;
        }
      }
    } // the close of the for argument loop

  if (!this->ParallelLevelSetInCli)
    {
    if (const char *parallel = cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL"))
      {
      int plevel = atoi(parallel);
      this->SetParallelLevel(plevel);
      }
    }

  // now what sould cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if(cmakeAndTest)
    {
    this->Verbose = true;
    cmCTestBuildAndTestHandler* handler =
      static_cast<cmCTestBuildAndTestHandler*>(this->GetHandler("buildtest"));
    int retv = handler->ProcessHandler();
    *output = handler->GetOutput();
#ifdef CMAKE_BUILD_WITH_CMAKE
    cmDynamicLoader::FlushCache();
#endif
    if(retv != 0)
      {
      cmCTestLog(this, DEBUG, "build and test failing returning: " << retv
                 << std::endl);
      }
    return retv;
    }

  if(executeTests)
    {
    int res;
    // call process directory
    if (this->RunConfigurationScript)
      {
      if ( this->ExtraVerbose )
        {
        cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
        }
      cmCTest::t_TestingHandlers::iterator it;
      for ( it = this->TestingHandlers.begin();
        it != this->TestingHandlers.end();
        ++ it )
        {
        it->second->SetVerbose(this->ExtraVerbose);
        it->second->SetSubmitIndex(this->SubmitIndex);
        }
      this->GetHandler("script")->SetVerbose(this->Verbose);
      res = this->GetHandler("script")->ProcessHandler();
      if(res != 0)
        {
        cmCTestLog(this, DEBUG, "running script failing returning: " << res
                   << std::endl);
        }

      }
    else
      {
      // What is this?  -V seems to be the same as -VV,
      // and Verbose is always on in this case
      this->ExtraVerbose = this->Verbose;
      this->Verbose = true;
      cmCTest::t_TestingHandlers::iterator it;
      for ( it = this->TestingHandlers.begin();
        it != this->TestingHandlers.end();
        ++ it )
        {
        it->second->SetVerbose(this->Verbose);
        it->second->SetSubmitIndex(this->SubmitIndex);
        }
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      if(!this->Initialize(cwd.c_str(), 0))
        {
        res = 12;
        cmCTestLog(this, ERROR_MESSAGE, "Problem initializing the dashboard."
          << std::endl);
        }
      else
        {
        res = this->ProcessTests();
        }
      this->Finalize();
      }
    if(res != 0)
      {
      cmCTestLog(this, DEBUG, "Running a test(s) failed returning : " << res
                 << std::endl);
      }
    return res;
    }

  return 1;
}